

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int Curl_parsenetrc(char *host,char *login,char *password,char *netrcfile)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  __uid_t __uid;
  FILE *__stream;
  char *pcVar6;
  passwd *ppVar7;
  char *__filename;
  char *pcVar8;
  char cVar9;
  bool bVar10;
  char *tok_buf;
  char netrcbuffer [256];
  int local_188;
  int local_184;
  char *local_140;
  char local_138 [264];
  
  cVar1 = *login;
  if (netrcfile == (char *)0x0) {
    pcVar6 = curl_getenv("HOME");
    bVar10 = pcVar6 != (char *)0x0;
    pcVar8 = pcVar6;
    if (!bVar10) {
      __uid = geteuid();
      ppVar7 = getpwuid(__uid);
      if (ppVar7 == (passwd *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = ppVar7->pw_dir;
      }
    }
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
    __filename = curl_maprintf("%s%s%s",pcVar8,"/",".netrc");
    if (__filename == (char *)0x0) {
      local_184 = -1;
      if (pcVar6 == (char *)0x0) {
        return -1;
      }
      goto LAB_00123a64;
    }
  }
  else {
    pcVar8 = (char *)0x0;
    bVar10 = false;
    __filename = netrcfile;
  }
  __stream = fopen64(__filename,"r");
  if (__stream == (FILE *)0x0) {
    local_184 = 1;
  }
  else {
    local_184 = 1;
    bVar4 = false;
    local_188 = 0;
    bVar3 = false;
    bVar2 = false;
    cVar9 = '\0';
    do {
      pcVar6 = fgets(local_138,0x100,__stream);
      if (pcVar6 == (char *)0x0) break;
      pcVar6 = strtok_r(local_138," \t\n",&local_140);
      while (pcVar6 != (char *)0x0) {
        if ((*login != '\0') && (*password != '\0')) {
          bVar4 = true;
          break;
        }
        if (cVar9 == '\x02') {
          if (bVar2) {
            if (cVar1 == '\0') {
              strncpy(login,pcVar6,0x3f);
            }
            else {
              local_188 = Curl_raw_equal(login,pcVar6);
            }
            cVar9 = '\x02';
            bVar2 = false;
          }
          else {
            if (bVar3) {
              cVar9 = '\x02';
              if (local_188 != 0 || cVar1 == '\0') {
                strncpy(password,pcVar6,0x3f);
              }
              bVar2 = false;
            }
            else {
              iVar5 = Curl_raw_equal("login",pcVar6);
              cVar9 = '\x02';
              if (iVar5 == 0) {
                iVar5 = Curl_raw_equal("password",pcVar6);
                bVar2 = false;
                if (iVar5 != 0) {
                  bVar3 = true;
                  goto LAB_001239c1;
                }
                iVar5 = Curl_raw_equal("machine",pcVar6);
                if (iVar5 != 0) {
                  local_188 = 0;
                }
                cVar9 = (iVar5 == 0) + '\x01';
              }
              else {
                bVar2 = true;
              }
            }
            bVar3 = false;
          }
        }
        else if (cVar9 == '\x01') {
          iVar5 = Curl_raw_equal(host,pcVar6);
          if (iVar5 != 0) {
            local_184 = 0;
          }
          cVar9 = (iVar5 != 0) * '\x02';
        }
        else if (cVar9 == '\0') {
          iVar5 = Curl_raw_equal("machine",pcVar6);
          cVar9 = iVar5 != 0;
        }
LAB_001239c1:
        pcVar6 = strtok_r((char *)0x0," \t\n",&local_140);
      }
    } while (!bVar4);
    fclose(__stream);
  }
  if (bVar10) {
    (*Curl_cfree)(pcVar8);
  }
  pcVar8 = __filename;
  if (netrcfile != (char *)0x0) {
    return local_184;
  }
LAB_00123a64:
  (*Curl_cfree)(pcVar8);
  return local_184;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char *login,
                    char *password,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (login[0] != 0);
  char *home = NULL;
  bool home_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
#ifdef __VMS
        home = decc_translate_vms(pw->pw_dir);
#else
        home = pw->pw_dir;
#endif
      }
#endif
    }

    if(!home)
      return -1;

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(!netrcfile) {
      if(home_alloc)
        free(home);
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, "r");
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if(login[0] && password[0]) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(Curl_raw_equal("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          break;
        case HOSTFOUND:
          if(Curl_raw_equal(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = Curl_raw_equal(login, tok);
            }
            else {
              strncpy(login, tok, LOGINSIZE-1);
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              strncpy(password, tok, PASSWORDSIZE-1);
            }
            state_password=0;
          }
          else if(Curl_raw_equal("login", tok))
            state_login=1;
          else if(Curl_raw_equal("password", tok))
            state_password=1;
          else if(Curl_raw_equal("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    fclose(file);
  }

  if(home_alloc)
    free(home);
  if(netrc_alloc)
    free(netrcfile);

  return retcode;
}